

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  int y;
  Var x_00;
  bool bVar1;
  int iVar2;
  Size SVar3;
  int *piVar4;
  Size local_44;
  int child;
  int x;
  int i_local;
  Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this_local;
  
  piVar4 = vec<int,_int>::operator[](&this->heap,i);
  y = *piVar4;
  child = i;
  while( true ) {
    iVar2 = left(child);
    SVar3 = vec<int,_int>::size(&this->heap);
    if (SVar3 <= iVar2) break;
    iVar2 = right(child);
    SVar3 = vec<int,_int>::size(&this->heap);
    if (iVar2 < SVar3) {
      iVar2 = right(child);
      piVar4 = vec<int,_int>::operator[](&this->heap,iVar2);
      x_00 = *piVar4;
      iVar2 = left(child);
      piVar4 = vec<int,_int>::operator[](&this->heap,iVar2);
      bVar1 = SimpSolver::ElimLt::operator()(&this->lt,x_00,*piVar4);
      if (!bVar1) goto LAB_00122eaa;
      local_44 = right(child);
    }
    else {
LAB_00122eaa:
      local_44 = left(child);
    }
    piVar4 = vec<int,_int>::operator[](&this->heap,local_44);
    bVar1 = SimpSolver::ElimLt::operator()(&this->lt,*piVar4,y);
    if (!bVar1) break;
    piVar4 = vec<int,_int>::operator[](&this->heap,local_44);
    iVar2 = *piVar4;
    piVar4 = vec<int,_int>::operator[](&this->heap,child);
    *piVar4 = iVar2;
    piVar4 = vec<int,_int>::operator[](&this->heap,child);
    piVar4 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,*piVar4);
    *piVar4 = child;
    child = local_44;
  }
  piVar4 = vec<int,_int>::operator[](&this->heap,child);
  *piVar4 = y;
  piVar4 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,y);
  *piVar4 = child;
  return;
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }